

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O0

void __thiscall OpenMD::Velocitizer::removeAngularDrift(Velocitizer *this)

{
  SimInfo *this_00;
  RectMatrix<double,_3U,_3U> *in_RDI;
  Vector3d tempComPos;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator ioi;
  MoleculeIterator mi;
  Vector3d omega;
  Vector3d angularMomentum;
  Mat3x3d inertiaTensor;
  Vector3d com;
  Vector3d vdrift;
  Vector3d *in_stack_00000360;
  Mat3x3d *in_stack_00000368;
  Thermo *in_stack_00000370;
  SquareMatrix3<double> *in_stack_fffffffffffffdb8;
  SimInfo *in_stack_fffffffffffffdc0;
  StuntDouble *in_stack_fffffffffffffdc8;
  StuntDouble *this_01;
  StuntDouble *in_stack_fffffffffffffdd8;
  SimInfo *in_stack_fffffffffffffde0;
  Vector3<double> *in_stack_fffffffffffffe20;
  Vector3<double> *in_stack_fffffffffffffe28;
  SquareMatrix3<double> *in_stack_fffffffffffffe58;
  Vector3d *in_stack_fffffffffffffec0;
  Vector3d *in_stack_fffffffffffffec8;
  SimInfo *pSVar1;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  in_stack_fffffffffffffed0;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_128 [37];
  
  Vector3<double>::Vector3((Vector3<double> *)0x18566e);
  Vector3<double>::Vector3((Vector3<double> *)0x185680);
  Thermo::getComAll((Thermo *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8,
                    in_stack_fffffffffffffec0);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1856a5);
  Vector3<double>::Vector3((Vector3<double> *)0x1856b2);
  Vector3<double>::Vector3((Vector3<double> *)0x1856c1);
  Thermo::getInertiaTensor(in_stack_00000370,in_stack_00000368,in_stack_00000360);
  SquareMatrix3<double>::inverse(in_stack_fffffffffffffe58);
  SquareMatrix3<double>::operator=
            ((SquareMatrix3<double> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x18571e);
  OpenMD::operator*(in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffde0);
  Vector3<double>::operator=
            ((Vector3<double> *)in_stack_fffffffffffffdc8,
             (Vector<double,_3U> *)in_stack_fffffffffffffdc0);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_128);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator((__normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
                       *)&stack0xfffffffffffffed0);
  Vector3<double>::Vector3((Vector3<double> *)0x18577b);
  this_00 = (SimInfo *)
            SimInfo::beginMolecule
                      (in_stack_fffffffffffffde0,(MoleculeIterator *)in_stack_fffffffffffffdd8);
  pSVar1 = this_00;
  while (pSVar1 != (SimInfo *)0x0) {
    in_stack_fffffffffffffdd8 =
         Molecule::beginIntegrableObject((Molecule *)this_00,(iterator *)in_stack_fffffffffffffdd8);
    this_01 = in_stack_fffffffffffffdd8;
    while (this_01 != (StuntDouble *)0x0) {
      StuntDouble::getPos(in_stack_fffffffffffffdc8);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdc8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffdc0);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffdc8,
                 (Vector<double,_3U> *)in_stack_fffffffffffffdc0);
      StuntDouble::getVel(in_stack_fffffffffffffdc8);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdc8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffdc0);
      cross<double>(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffdc8,
                        (Vector<double,_3U> *)in_stack_fffffffffffffdc0);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_stack_fffffffffffffdc0,
                 (Vector<double,_3U> *)in_stack_fffffffffffffdb8);
      StuntDouble::setVel(this_01,(Vector3d *)in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffdc8 =
           Molecule::nextIntegrableObject((Molecule *)this_00,(iterator *)in_stack_fffffffffffffdd8)
      ;
      this_01 = in_stack_fffffffffffffdc8;
    }
    in_stack_fffffffffffffdc0 =
         (SimInfo *)SimInfo::nextMolecule(this_00,(MoleculeIterator *)in_stack_fffffffffffffdd8);
    pSVar1 = in_stack_fffffffffffffdc0;
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x185974);
  return;
}

Assistant:

void Velocitizer::removeAngularDrift() {
    // Get the Center of Mass drift velocity.

    Vector3d vdrift;
    Vector3d com;

    thermo_.getComAll(com, vdrift);

    Mat3x3d inertiaTensor;
    Vector3d angularMomentum;
    Vector3d omega;

    thermo_.getInertiaTensor(inertiaTensor, angularMomentum);

    // We now need the inverse of the inertia tensor.
    inertiaTensor = inertiaTensor.inverse();
    omega         = inertiaTensor * angularMomentum;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d tempComPos;

    // Corrects for the center of mass angular drift by summing all
    // the angular momentum and dividing by the total mass.

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        tempComPos = sd->getPos() - com;
        sd->setVel((sd->getVel() - vdrift) - cross(omega, tempComPos));
      }
    }
  }